

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrgba64_p.h
# Opt level: O2

QRgba64 rgbBlend(QRgba64 d,QRgba64 s,uint rgbAlpha)

{
  undefined1 auVar1 [12];
  undefined1 auVar2 [12];
  unkbyte10 Var3;
  unkbyte10 Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  uint uVar9;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  uint uVar16;
  uint uVar17;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ushort uVar20;
  undefined1 auVar18 [16];
  undefined1 auVar12 [16];
  undefined1 auVar19 [16];
  
  auVar5._8_8_ = 0;
  auVar5._0_8_ = d.rgba;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = s.rgba;
  uVar15 = (undefined1)(rgbAlpha >> 0x18);
  uVar14 = (undefined1)(rgbAlpha >> 0x10);
  uVar13 = (undefined1)(rgbAlpha >> 8);
  auVar10._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar15,uVar15),uVar14),CONCAT14(uVar14,rgbAlpha)) >> 0x20);
  auVar10[3] = uVar13;
  auVar10[2] = uVar13;
  auVar10[0] = (undefined1)rgbAlpha;
  auVar10[1] = auVar10[0];
  auVar10._8_8_ = 0;
  auVar10 = pshuflw(auVar10,auVar10,0xc6);
  uVar20 = auVar10._6_2_ * (short)(s.rgba >> 0x30);
  auVar19._0_12_ = ZEXT212(uVar20) << 0x30;
  auVar7 = pmulhuw(auVar6,auVar10);
  auVar19._12_2_ = uVar20;
  auVar19._14_2_ = auVar7._6_2_;
  auVar18._12_4_ = auVar19._12_4_;
  auVar18._0_10_ = (unkuint10)uVar20 << 0x30;
  auVar18._10_2_ = auVar7._4_2_;
  Var3 = CONCAT64(auVar18._10_6_,CONCAT22(auVar10._4_2_ * (short)(s.rgba >> 0x20),uVar20));
  auVar1._4_8_ = (long)((unkuint10)Var3 >> 0x10);
  auVar1._2_2_ = auVar7._2_2_;
  auVar1._0_2_ = auVar10._2_2_ * (short)(s.rgba >> 0x10);
  auVar8._8_4_ = 0xffffffff;
  auVar8._0_8_ = 0xffffffffffffffff;
  auVar8._12_4_ = 0xffffffff;
  auVar8 = auVar8 ^ auVar10;
  uVar20 = auVar8._6_2_ * (short)(d.rgba >> 0x30);
  auVar12._0_12_ = ZEXT212(uVar20) << 0x30;
  auVar5 = pmulhuw(auVar8,auVar5);
  auVar12._12_2_ = uVar20;
  auVar12._14_2_ = auVar5._6_2_;
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._0_10_ = (unkuint10)uVar20 << 0x30;
  auVar11._10_2_ = auVar5._4_2_;
  Var4 = CONCAT64(auVar11._10_6_,CONCAT22(auVar8._4_2_ * (short)(d.rgba >> 0x20),uVar20));
  auVar2._4_8_ = (long)((unkuint10)Var4 >> 0x10);
  auVar2._2_2_ = auVar5._2_2_;
  auVar2._0_2_ = auVar8._2_2_ * (short)(d.rgba >> 0x10);
  uVar9 = CONCAT22(auVar5._0_2_,auVar8._0_2_ * (short)d.rgba) +
          CONCAT22(auVar7._0_2_,auVar10._0_2_ * (short)s.rgba);
  uVar16 = auVar2._0_4_ + auVar1._0_4_;
  uVar17 = (int)((unkuint10)Var4 >> 0x10) + (int)((unkuint10)Var3 >> 0x10);
  auVar7._0_4_ = (int)((uVar9 >> 0x10) + uVar9 + 0x8000) >> 0x10;
  auVar7._4_4_ = (int)((uVar16 >> 0x10) + uVar16 + 0x8000) >> 0x10;
  auVar7._8_4_ = (int)((uVar17 >> 0x10) + uVar17 + 0x8000) >> 0x10;
  auVar7._12_4_ =
       (int)(((uint)(auVar11._12_4_ + auVar18._12_4_) >> 0x10) + auVar11._12_4_ + auVar18._12_4_ +
            0x8000) >> 0x10;
  auVar5 = packssdw(auVar7,auVar7);
  return (QRgba64)auVar5._0_8_;
}

Assistant:

static inline QRgba64 rgbBlend(QRgba64 d, QRgba64 s, uint rgbAlpha)
{
    QRgba64 blend;
#if defined(__SSE2__)
    __m128i vd = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(&d));
    __m128i vs = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(&s));
    __m128i va =  _mm_cvtsi32_si128(rgbAlpha);
    va = _mm_unpacklo_epi8(va, va);
    va = _mm_shufflelo_epi16(va, _MM_SHUFFLE(3, 0, 1, 2));
    __m128i vb = _mm_xor_si128(_mm_set1_epi16(-1), va);

    vs = _mm_unpacklo_epi16(_mm_mullo_epi16(vs, va), _mm_mulhi_epu16(vs, va));
    vd = _mm_unpacklo_epi16(_mm_mullo_epi16(vd, vb), _mm_mulhi_epu16(vd, vb));
    vd = _mm_add_epi32(vd, vs);
    vd = _mm_add_epi32(vd, _mm_srli_epi32(vd, 16));
    vd = _mm_add_epi32(vd, _mm_set1_epi32(0x8000));
    vd = _mm_srai_epi32(vd, 16);
    vd = _mm_packs_epi32(vd, vd);

    _mm_storel_epi64(reinterpret_cast<__m128i *>(&blend), vd);
#elif defined(__ARM_NEON__)
    uint16x4_t vd = vreinterpret_u16_u64(vmov_n_u64(d));
    uint16x4_t vs = vreinterpret_u16_u64(vmov_n_u64(s));
    uint8x8_t va8 = vreinterpret_u8_u32(vmov_n_u32(ARGB2RGBA(rgbAlpha)));
    uint16x4_t va = vreinterpret_u16_u8(vzip_u8(va8, va8).val[0]);
    uint16x4_t vb = veor_u16(vdup_n_u16(0xffff), va);

    uint32x4_t vs32 = vmull_u16(vs, va);
    uint32x4_t vd32 = vmull_u16(vd, vb);
    vd32 = vaddq_u32(vd32, vs32);
    vd32 = vsraq_n_u32(vd32, vd32, 16);
    vd = vrshrn_n_u32(vd32, 16);
    vst1_u64(reinterpret_cast<uint64_t *>(&blend), vreinterpret_u64_u16(vd));
#elif defined(__loongarch_sx)
    __m128i vd = __lsx_vldrepl_d(reinterpret_cast<const __m128i *>(&d), 0);
    __m128i vs = __lsx_vldrepl_d(reinterpret_cast<const __m128i *>(&s), 0);
    __m128i va = __lsx_vinsgr2vr_w(__lsx_vldi(0), rgbAlpha, 0);
    va = __lsx_vilvl_b(va, va);
    const __m128i shuffleMask = (__m128i)(v8i16){2, 1, 0, 3, 4, 5, 6, 7};
    va = __lsx_vshuf_h(shuffleMask, __lsx_vldi(0), va);
    __m128i vb = __lsx_vxor_v(__lsx_vreplgr2vr_h(-1), va);

    vs = __lsx_vilvl_h(__lsx_vmuh_hu(vs, va), __lsx_vmul_h(vs, va));
    vd = __lsx_vilvl_h(__lsx_vmuh_hu(vd, vb), __lsx_vmul_h(vd, vb));
    vd = __lsx_vadd_w(vd, vs);
    vd = __lsx_vadd_w(vd, __lsx_vsrli_w(vd, 16));
    vd = __lsx_vadd_w(vd, __lsx_vreplgr2vr_w(0x8000));
    vd = __lsx_vsrai_w(vd, 16);
    vd = __lsx_vpickev_h(__lsx_vsat_w(vd, 15), __lsx_vsat_w(vd, 15));
    __lsx_vstelm_d(vd, reinterpret_cast<__m128i *>(&blend), 0, 0);
#else
    const int mr = qRed(rgbAlpha);
    const int mg = qGreen(rgbAlpha);
    const int mb = qBlue(rgbAlpha);
    blend = qRgba64(qt_div_255(s.red()   * mr + d.red()   * (255 - mr)),
                    qt_div_255(s.green() * mg + d.green() * (255 - mg)),
                    qt_div_255(s.blue()  * mb + d.blue()  * (255 - mb)),
                    s.alpha());
#endif
    return blend;
}